

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

void __thiscall QHttpNetworkRequest::clearHeaders(QHttpNetworkRequest *this)

{
  QHttpNetworkRequestPrivate *this_00;
  
  this_00 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(&this->d);
  QHttpNetworkHeaderPrivate::clearHeaders(&this_00->super_QHttpNetworkHeaderPrivate);
  return;
}

Assistant:

void QHttpNetworkRequest::clearHeaders()
{
    d->clearHeaders();
}